

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opts.h
# Opt level: O1

string * __thiscall
opts::OptionContainer<unsigned_long>::default_value_abi_cxx11_
          (string *__return_storage_ptr__,OptionContainer<unsigned_long> *this,unsigned_long *def)

{
  ostringstream oss;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

static
    std::string     default_value(const T& def)
    {
        std::ostringstream oss;
        oss << def;
        return oss.str();
    }